

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

int64_t float128_to_int64_sparc(float128 a,float_status *status)

{
  ulong uVar1;
  int64_t iVar2;
  byte bVar3;
  uint64_t absZ1;
  ulong uVar4;
  ulong absZ0;
  uint uVar5;
  
  uVar4 = a.low;
  uVar1 = a.high & 0xffffffffffff;
  uVar5 = a.high._6_2_ & 0x7fff;
  absZ0 = uVar1 | 0x1000000000000;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
    absZ0 = uVar1;
  }
  if (uVar5 < 0x402f) {
    if (uVar5 < 0x3ff0) {
      if (uVar5 == 0x3fef) {
        absZ1 = absZ0 | uVar4 != 0;
      }
      else {
        absZ1 = (uint64_t)(absZ0 != 0 || uVar4 != 0);
      }
      absZ0 = 0;
    }
    else {
      absZ1 = (ulong)(uVar4 != 0) | absZ0 << (a.high._6_1_ + 0x11U & 0x3f);
      absZ0 = absZ0 >> (0x2fU - (char)uVar5 & 0x3f);
    }
  }
  else {
    if (0x403e < uVar5) {
      status->float_exception_flags = status->float_exception_flags | 1;
      if (((long)a.high < 0) && ((uVar5 != 0x7fff || ((uVar4 == 0 && (absZ0 == 0x1000000000000))))))
      {
        return -0x8000000000000000;
      }
      return 0x7fffffffffffffff;
    }
    bVar3 = (byte)(uVar5 - 0x402f);
    absZ1 = uVar4 << (bVar3 & 0x3f);
    if (uVar5 - 0x402f != 0) {
      absZ0 = absZ0 << (bVar3 & 0x3f) | uVar4 >> (0x2fU - a.high._6_1_ & 0x3f);
    }
  }
  iVar2 = roundAndPackInt64(a.high._7_1_ >> 7,absZ0,absZ1,status);
  return iVar2;
}

Assistant:

int64_t float128_to_int64(float128 a, float_status *status)
{
    flag aSign;
    int32_t aExp, shiftCount;
    uint64_t aSig0, aSig1;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    if ( aExp ) aSig0 |= UINT64_C(0x0001000000000000);
    shiftCount = 0x402F - aExp;
    if ( shiftCount <= 0 ) {
        if ( 0x403E < aExp ) {
            float_raise(float_flag_invalid, status);
            if (    ! aSign
                 || (    ( aExp == 0x7FFF )
                      && ( aSig1 || ( aSig0 != UINT64_C(0x0001000000000000) ) )
                    )
               ) {
                return INT64_MAX;
            }
            return INT64_MIN;
        }
        shortShift128Left( aSig0, aSig1, - shiftCount, &aSig0, &aSig1 );
    }
    else {
        shift64ExtraRightJamming( aSig0, aSig1, shiftCount, &aSig0, &aSig1 );
    }
    return roundAndPackInt64(aSign, aSig0, aSig1, status);

}